

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O2

void Imf_3_4::anon_unknown_0::sendCode
               (uint64_t sCode,int runCount,uint64_t runCode,uint64_t *c,int *lc,char **out)

{
  ulong uVar1;
  
  uVar1 = (ulong)((uint)sCode & 0x3f);
  if (uVar1 * (long)runCount <= ((uint)runCode & 0x3f) + uVar1 + 8) {
    for (; -1 < runCount; runCount = runCount + -1) {
      outputCode(sCode,c,lc,out);
    }
    return;
  }
  outputCode(sCode,c,lc,out);
  outputCode(runCode,c,lc,out);
  outputBits(8,(long)runCount,c,lc,out);
  return;
}

Assistant:

inline void
sendCode (
    uint64_t  sCode,
    int       runCount,
    uint64_t  runCode,
    uint64_t& c,
    int&      lc,
    char*&    out)
{
    //
    // Output a run of runCount instances of the symbol sCount.
    // Output the symbols explicitly, or if that is shorter, output
    // the sCode symbol once followed by a runCode symbol and runCount
    // expressed as an 8-bit number.
    //

    if (hufLength (sCode) + hufLength (runCode) + 8 <
        hufLength (sCode) * runCount)
    {
        outputCode (sCode, c, lc, out);
        outputCode (runCode, c, lc, out);
        outputBits (8, runCount, c, lc, out);
    }
    else
    {
        while (runCount-- >= 0)
            outputCode (sCode, c, lc, out);
    }
}